

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedFunctions.cpp
# Opt level: O0

bool Refal2::embeddedCvd(CExecutionContext *executionContext)

{
  bool bVar1;
  string local_68 [8];
  string text;
  undefined1 local_38 [8];
  CArbitraryInteger number;
  CExecutionContext *executionContext_local;
  
  number._24_8_ = executionContext;
  CArbitraryInteger::CArbitraryInteger((CArbitraryInteger *)local_38);
  bVar1 = readNumber((CUnitList *)number._24_8_,(CArbitraryInteger *)local_38);
  if (bVar1) {
    std::__cxx11::string::string(local_68);
    CArbitraryInteger::GetTextValue((CArbitraryInteger *)local_38,(string *)local_68);
    CNodeList<Refal2::CUnit>::Empty((CNodeList<Refal2::CUnit> *)number._24_8_);
    CUnitList::AppendText((CUnitList *)number._24_8_,(string *)local_68);
    std::__cxx11::string::~string(local_68);
  }
  CArbitraryInteger::~CArbitraryInteger((CArbitraryInteger *)local_38);
  return bVar1;
}

Assistant:

static bool embeddedCvd( CExecutionContext& executionContext )
{
	DEBUG_PRINT( __FUNCTION__ )
	CArbitraryInteger number;
	if( !readNumber( executionContext.Argument, number ) ) {
		return false;
	}
	std::string text;
	number.GetTextValue( text );
	executionContext.Argument.Empty();
	executionContext.Argument.AppendText( text );
	return true;
}